

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<Fad<double>_>::PutSub
          (TPZMatrix<Fad<double>_> *this,int64_t sRow,int64_t sCol,TPZFMatrix<Fad<double>_> *A)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long local_70;
  Fad<double> local_50;
  
  lVar3 = (this->super_TPZBaseMatrix).fRow;
  if (lVar3 <= sRow) {
    poVar1 = std::operator<<((ostream *)&std::cout,"incompatible dimensions");
    std::endl<char,std::char_traits<char>>(poVar1);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp"
               ,0x1e4);
  }
  lVar3 = lVar3 - sRow;
  lVar2 = (A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  lVar4 = (A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
  if (lVar2 < lVar3) {
    lVar3 = lVar2;
  }
  lVar2 = (this->super_TPZBaseMatrix).fCol - sCol;
  if (lVar4 < lVar2) {
    lVar2 = lVar4;
  }
  lVar4 = 0;
  if (lVar2 < 1) {
    lVar2 = lVar4;
  }
  if (lVar3 < 1) {
    lVar3 = lVar4;
  }
  local_70 = sRow;
  for (; lVar4 != lVar3; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; lVar2 != lVar5; lVar5 = lVar5 + 1) {
      (*(A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(&local_50,A,lVar4,lVar5);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,local_70,sCol + lVar5,&local_50);
      Fad<double>::~Fad(&local_50);
    }
    local_70 = local_70 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::PutSub(const int64_t sRow,const int64_t sCol,const TPZFMatrix<TVar> &A ) {
    if(sRow >= this->Rows()){
        LOGPZ_ERROR(logger,"incompatible dimensions")
        DebugStop();
    }

    int64_t minRow = MIN( A.Rows(), Rows() - sRow );
    int64_t minCol = MIN( A.Cols(), Cols() - sCol );
	
    int64_t row = sRow;
    for ( int64_t r = 0; r < minRow; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = 0; c < minCol; c++, col++ ) {
            PutVal( row, col, A.GetVal( r, c ) );
        }
    }
    return( 1 );
}